

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O3

REF_STATUS ref_adj_add(REF_ADJ ref_adj,REF_INT node,REF_INT reference)

{
  uint uVar1;
  REF_STATUS RVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM __ptr;
  int iVar4;
  uint uVar5;
  undefined8 uVar6;
  ulong uVar7;
  REF_INT RVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  
  if (node < 0) {
    return 3;
  }
  uVar10 = ref_adj->nnode;
  uVar5 = uVar10;
  if (node < (int)uVar10) {
LAB_00199b11:
    uVar10 = ref_adj->blank;
    if (uVar10 == 0xffffffff) {
      uVar10 = ref_adj->nitem;
      lVar11 = (long)(int)uVar10;
      if (lVar11 == 0x7fffffff) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0x81,
               "ref_adj_add","the number of ref_adj items is too large for int, cannot grow");
        return 1;
      }
      uVar5 = 100;
      if (100 < (int)((double)(int)uVar10 * 0.5)) {
        uVar5 = (int)((double)(int)uVar10 * 0.5);
      }
      uVar1 = uVar10 ^ 0x7fffffff;
      if ((int)uVar5 < (int)(uVar10 ^ 0x7fffffff)) {
        uVar1 = uVar5;
      }
      ref_adj->nitem = uVar1 + uVar10;
      fflush(_stdout);
      __ptr = ref_adj->item;
      if (0 < (long)ref_adj->nitem) {
        __ptr = (REF_ADJ_ITEM)realloc(__ptr,(long)ref_adj->nitem << 3);
        ref_adj->item = __ptr;
      }
      if (__ptr == (REF_ADJ_ITEM)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0x88,
               "ref_adj_add","realloc ref_adj->item NULL");
        uVar7 = (ulong)ref_adj->nitem;
        lVar11 = uVar7 * 8;
        uVar6 = 8;
        goto LAB_00199cbf;
      }
      iVar4 = ref_adj->nitem;
      if ((int)uVar10 < iVar4) {
        lVar9 = 0;
        do {
          __ptr[lVar11 + lVar9].ref = -1;
          __ptr[lVar11 + lVar9].next = uVar10 + 1 + (int)lVar9;
          lVar9 = lVar9 + 1;
        } while (iVar4 - lVar11 != lVar9);
      }
      __ptr[(long)iVar4 + -1].next = -1;
      uVar5 = ref_adj->nnode;
    }
    else {
      __ptr = ref_adj->item;
    }
    ref_adj->blank = __ptr[(int)uVar10].next;
    __ptr[(int)uVar10].ref = reference;
    pRVar3 = ref_adj->first;
    RVar8 = -1;
    if (node < (int)uVar5) {
      RVar8 = pRVar3[(uint)node];
    }
    __ptr[(int)uVar10].next = RVar8;
    pRVar3[(uint)node] = uVar10;
    RVar2 = 0;
  }
  else {
    iVar4 = 0;
    if (0 < (int)(node - uVar10)) {
      iVar4 = node - uVar10;
    }
    uVar5 = iVar4 + 100U;
    if ((int)(iVar4 + 100U) <= (int)((double)(int)uVar10 * 0.5)) {
      uVar5 = (int)((double)(int)uVar10 * 0.5);
    }
    uVar1 = uVar10 ^ 0x7fffffff;
    if ((int)uVar5 < (int)(uVar10 ^ 0x7fffffff)) {
      uVar1 = uVar5;
    }
    ref_adj->nnode = uVar1 + uVar10;
    fflush(_stdout);
    pRVar3 = ref_adj->first;
    if (0 < (long)ref_adj->nnode) {
      pRVar3 = (REF_INT *)realloc(pRVar3,(long)ref_adj->nnode << 2);
      ref_adj->first = pRVar3;
    }
    if (pRVar3 != (REF_INT *)0x0) {
      uVar5 = ref_adj->nnode;
      if ((int)uVar10 < ref_adj->nnode) {
        lVar11 = (long)(int)uVar10;
        do {
          pRVar3[lVar11] = -1;
          lVar11 = lVar11 + 1;
          uVar5 = ref_adj->nnode;
        } while (lVar11 < ref_adj->nnode);
      }
      goto LAB_00199b11;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0x7a,
           "ref_adj_add","realloc ref_adj->first NULL");
    uVar7 = (ulong)ref_adj->nnode;
    lVar11 = uVar7 * 4;
    uVar6 = 4;
LAB_00199cbf:
    printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar7 & 0xffffffff,uVar7,uVar6
           ,lVar11);
    RVar2 = 2;
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_adj_add(REF_ADJ ref_adj, REF_INT node,
                               REF_INT reference) {
  REF_INT item;
  REF_INT orig, chunk, i;
  REF_INT max_limit = REF_INT_MAX;

  if (node < 0) return REF_INVALID;

  if (node >= ref_adj_nnode(ref_adj)) {
    orig = ref_adj_nnode(ref_adj);
    chunk = 100 + MAX(0, node - orig);
    chunk = MAX(chunk, (REF_INT)(0.5 * (REF_DBL)orig));
    /* try to keep under 32-bit limit */
    chunk = MIN(chunk, max_limit - orig);
    ref_adj_nnode(ref_adj) = orig + chunk;
    ref_realloc(ref_adj->first, ref_adj_nnode(ref_adj), REF_INT);
    for (i = orig; i < ref_adj_nnode(ref_adj); i++)
      ref_adj->first[i] = REF_EMPTY;
  }

  if (REF_EMPTY == ref_adj_blank(ref_adj)) {
    RAS(ref_adj_nitem(ref_adj) != max_limit,
        "the number of ref_adj items is too large for int, cannot grow");

    orig = ref_adj_nitem(ref_adj);
    chunk = MAX(100, (REF_INT)(0.5 * (REF_DBL)orig));
    /* try to keep under 32-bit limit */
    chunk = MIN(chunk, max_limit - orig);
    ref_adj_nitem(ref_adj) = orig + chunk;
    ref_realloc(ref_adj->item, ref_adj_nitem(ref_adj), REF_ADJ_ITEM_STRUCT);
    for (i = orig; i < ref_adj_nitem(ref_adj); i++) {
      ref_adj->item[i].ref = REF_EMPTY;
      ref_adj->item[i].next = i + 1;
    }
    ref_adj->item[ref_adj_nitem(ref_adj) - 1].next = REF_EMPTY;
    ref_adj->blank = orig;
  }

  item = ref_adj_blank(ref_adj);
  ref_adj_blank(ref_adj) = ref_adj_item_next(ref_adj, item);

  ref_adj_item_ref(ref_adj, item) = reference;
  ref_adj_item_next(ref_adj, item) = ref_adj_first(ref_adj, node);

  ref_adj->first[node] = item;

  return REF_SUCCESS;
}